

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

Result __thiscall
presolve::HPresolve::liftingForProbing(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  _Rb_tree_node_base *__args;
  map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
  *this_00;
  HighsMipSolverData *pHVar1;
  _Base_ptr p_Var2;
  pointer ppVar3;
  pointer pdVar4;
  Result RVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  HighsPostsolveStack *pHVar8;
  int iVar9;
  _Base_ptr p_Var10;
  uint uVar11;
  const_iterator __begin2;
  HighsDomain *pHVar12;
  pointer ppVar13;
  _Link_type p_Var14;
  HighsPostsolveStack *pHVar15;
  HighsDomain *pHVar16;
  HighsCliqueTable *pHVar17;
  const_iterator __end2;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *clique;
  long lVar18;
  CliqueVar *cliquevar;
  _Base_ptr p_Var19;
  HighsLp *pHVar20;
  double dVar21;
  double dVar22;
  bool isredundant;
  bool dense;
  bool fillallowed;
  HighsInt row;
  HighsInt bestnfill;
  double bestscore;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> candidates;
  double bestscoretotal;
  map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
  coefficients;
  vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
  cliques;
  anon_class_8_1_0b815314 computeOverallScore;
  vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
  liftingtable;
  bool local_16f;
  bool local_16e;
  bool local_16d;
  undefined1 local_16c [52];
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> local_138;
  HighsDomain *local_120;
  HighsPostsolveStack *local_118;
  HighsCliqueTable *local_110;
  HighsPostsolveStack *local_108;
  _Base_ptr local_100;
  undefined1 local_f8 [16];
  _Rb_tree_node_base local_e8;
  pointer local_c8;
  vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
  local_c0;
  anon_class_64_8_9ac467b2 local_a8;
  vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
  local_68;
  HighsDomain *local_48;
  pointer piStack_40;
  
  pHVar1 = (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  local_68.
  super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
  ::reserve(&local_68,(this->liftingOpportunities)._M_h._M_element_count);
  local_f8._0_8_ = &DAT_fff0000000000000;
  local_16d = 0 < (this->mipsolver->options_mip_->super_HighsOptionsStruct).mip_lifting_for_probing;
  local_e8._M_left = &local_e8;
  local_e8._M_color = _S_red;
  local_e8._M_parent = (_Base_ptr)0x0;
  local_16c._36_8_ = 0;
  local_c8 = (pointer)0x0;
  pHVar8 = (HighsPostsolveStack *)(this->liftingOpportunities)._M_h._M_before_begin._M_nxt;
  local_e8._M_right = local_e8._M_left;
  if (pHVar8 != (HighsPostsolveStack *)0x0) {
    local_110 = &pHVar1->cliquetable;
    pHVar12 = &pHVar1->domain;
    this_00 = (map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
               *)(local_f8 + 8);
    local_16c._36_8_ = 0;
    local_120 = pHVar12;
    local_118 = postsolve_stack;
    do {
      local_16c._0_4_ = *(undefined4 *)&pHVar8->debug_prev_col_lower;
      if ((this->rowDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start[(int)local_16c._0_4_] == '\0') {
        iVar9 = (this->model->num_col_ - this->numDeletedCols) / 0x14;
        if (iVar9 < 0x3e9) {
          iVar9 = 1000;
        }
        local_16e = iVar9 < (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[(int)local_16c._0_4_];
        local_a8.htree = (HighsHashTree<std::pair<int,_int>,_double> *)&pHVar8->debug_prev_col_upper
        ;
        local_16f = false;
        local_a8.row = (HighsInt *)local_16c;
        local_a8.isredundant = &local_16f;
        local_a8.dense = &local_16e;
        local_a8.fillallowed = &local_16d;
        local_a8.this = this;
        local_a8.domain = pHVar12;
        local_a8.coefficients = this_00;
        HighsHashTree<std::pair<int,_int>,_double>::
        for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:1739:20)_&,_0>
                  ((NodePtr)pHVar8->debug_prev_col_upper,&local_a8);
        if (local_16f == true) {
          HighsPostsolveStack::redundantRow(postsolve_stack,local_16c._0_4_);
          p_Var14 = (_Link_type)(ulong)(uint)local_16c._0_4_;
          removeRow(this,local_16c._0_4_);
          std::
          _Rb_tree<HighsCliqueTable::CliqueVar,_std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>,_std::_Select1st<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/presolve/HPresolve.cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
          ::_M_erase((_Rb_tree<HighsCliqueTable::CliqueVar,_std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>,_std::_Select1st<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
                      *)local_e8._M_parent,p_Var14);
          local_e8._M_parent = (_Base_ptr)0x0;
          local_e8._M_left = &local_e8;
          local_c8 = (pointer)0x0;
          pHVar15 = postsolve_stack;
          local_e8._M_right = local_e8._M_left;
          RVar5 = checkLimits(this,postsolve_stack);
          if (RVar5 != kOk) goto LAB_0030c52b;
          local_16c._36_8_ = ZEXT48((int)local_16c._36_8_ + 1);
        }
        else if (local_c8 != (pointer)0x0) {
          local_a8.this = (HPresolve *)0x0;
          local_a8.row = (HighsInt *)0x0;
          local_a8.isredundant = (bool *)0x0;
          local_16c._28_8_ = &DAT_fff0000000000000;
          local_16c._24_4_ = 0;
          local_138.
          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (CliqueVar *)0x0;
          local_138.
          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_138.
          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
          ._M_impl.super__Vector_impl_data._M_finish = (CliqueVar *)0x0;
          local_108 = pHVar8;
          std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
          reserve(&local_138,(size_type)local_c8);
          for (p_Var10 = local_e8._M_left; p_Var10 != &local_e8;
              p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
            __args = p_Var10 + 1;
            if (local_138.
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_138.
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
              _M_realloc_insert<HighsCliqueTable::CliqueVar_const&>
                        ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                          *)&local_138,
                         (iterator)
                         local_138.
                         super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(CliqueVar *)__args);
            }
            else {
              *local_138.
               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
               ._M_impl.super__Vector_impl_data._M_finish = (CliqueVar)__args->_M_color;
              local_138.
              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_138.
                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            iVar9 = *(int *)&p_Var10[1]._M_left;
            if ((long)iVar9 == -1) {
              dVar22 = 0.0;
            }
            else {
              dVar22 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar9];
            }
            pHVar20 = (HighsLp *)ABS((double)p_Var10[1]._M_parent - dVar22);
            if ((double)local_16c._28_8_ < (double)pHVar20) {
              local_16c._24_4_ = ZEXT14(iVar9 == -1);
              local_c0.
              super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = __args->_M_color;
              local_16c._28_8_ = pHVar20;
              local_c0.
              super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var10[1]._M_parent;
              std::
              vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>
              ::_M_assign_aux<std::pair<HighsCliqueTable::CliqueVar,double>const*>
                        ((vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>
                          *)&local_a8,&local_c0,
                         &local_c0.
                          super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
          }
          if (4 < (ulong)((long)local_138.
                                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_138.
                               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                               ._M_impl.super__Vector_impl_data._M_start)) {
            HighsCliqueTable::computeMaximalCliques
                      (&local_c0,local_110,&local_138,this->primal_feastol);
            p_Var10 = (_Base_ptr)
                      CONCAT44(local_c0.
                               super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                               (_Rb_tree_color)
                               local_c0.
                               super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
            local_100 = (_Base_ptr)
                        local_c0.
                        super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            if (p_Var10 !=
                (_Base_ptr)
                local_c0.
                super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              do {
                p_Var19 = *(_Base_ptr *)p_Var10;
                p_Var2 = p_Var10->_M_parent;
                pHVar20 = (HighsLp *)0x0;
                if (p_Var19 == p_Var2) {
                  uVar11 = 0;
                }
                else {
                  local_16c._4_8_ = 0.0;
                  uVar11 = 0;
                  local_16c._12_8_ = 0.0;
                  do {
                    pmVar6 = std::
                             map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/presolve/HPresolve.cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
                             ::operator[](this_00,(key_type *)p_Var19);
                    local_48 = (HighsDomain *)pmVar6->first;
                    piStack_40 = (pointer)0x0;
                    pmVar6 = std::
                             map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/presolve/HPresolve.cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
                             ::operator[](this_00,(key_type *)p_Var19);
                    if ((long)pmVar6->second == -1) {
                      local_16c._44_8_ = 0.0;
                    }
                    else {
                      local_16c._44_8_ =
                           (this->Avalue).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start[pmVar6->second];
                    }
                    pmVar6 = std::
                             map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/presolve/HPresolve.cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
                             ::operator[](this_00,(key_type *)p_Var19);
                    dVar21 = ABS((double)local_48 - (double)local_16c._44_8_);
                    dVar22 = (double)local_16c._12_8_ + dVar21;
                    local_16c._4_8_ =
                         (double)local_16c._4_8_ +
                         ((dVar22 - dVar21) - dVar22) + dVar21 +
                         ((double)local_16c._12_8_ - (dVar22 - dVar21));
                    uVar11 = uVar11 + (pmVar6->second == -1);
                    p_Var19 = (_Base_ptr)&p_Var19->field_0x4;
                    local_16c._12_8_ = dVar22;
                  } while (p_Var19 != p_Var2);
                  pHVar20 = (HighsLp *)(dVar22 + (double)local_16c._4_8_);
                }
                if ((double)local_16c._28_8_ < (double)pHVar20) {
                  if ((HPresolve *)local_a8.row != local_a8.this) {
                    local_a8.row = (HighsInt *)local_a8.this;
                  }
                  local_16c._24_4_ = uVar11;
                  local_16c._28_8_ = pHVar20;
                  std::
                  vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                  ::reserve((vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                             *)&local_a8,(long)p_Var10->_M_parent - *(long *)p_Var10 >> 2);
                  p_Var2 = p_Var10->_M_parent;
                  for (p_Var19 = *(_Base_ptr *)p_Var10; p_Var19 != p_Var2;
                      p_Var19 = (_Base_ptr)&p_Var19->field_0x4) {
                    pmVar6 = std::
                             map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/presolve/HPresolve.cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
                             ::operator[](this_00,(key_type *)p_Var19);
                    std::
                    vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>
                    ::emplace_back<HighsCliqueTable::CliqueVar_const&,double&>
                              ((vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>
                                *)&local_a8,(CliqueVar *)p_Var19,&pmVar6->first);
                  }
                }
                p_Var10 = (_Base_ptr)&p_Var10->_M_right;
              } while (p_Var10 != local_100);
            }
            std::
            vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
            ::~vector(&local_c0);
            pHVar12 = local_120;
            postsolve_stack = local_118;
          }
          p_Var14 = (_Link_type)local_16c;
          std::
          vector<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>,std::allocator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>>>
          ::
          emplace_back<int&,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>&,double&,int&>
                    ((vector<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>,std::allocator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>>>
                      *)&local_68,(int *)p_Var14,
                     (vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                      *)&local_a8,(double *)(local_16c + 0x1c),(int *)(local_16c + 0x18));
          pHVar20 = (HighsLp *)local_16c._28_8_;
          if ((double)local_16c._28_8_ <= (double)local_f8._0_8_) {
            pHVar20 = (HighsLp *)local_f8._0_8_;
          }
          local_f8._0_8_ = pHVar20;
          std::
          _Rb_tree<HighsCliqueTable::CliqueVar,_std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>,_std::_Select1st<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/presolve/HPresolve.cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
          ::_M_erase((_Rb_tree<HighsCliqueTable::CliqueVar,_std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>,_std::_Select1st<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
                      *)local_e8._M_parent,p_Var14);
          pHVar8 = local_108;
          local_e8._M_parent = (_Base_ptr)0x0;
          local_e8._M_left = &local_e8;
          local_c8 = (pointer)0x0;
          local_e8._M_right = local_e8._M_left;
          if (local_138.
              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_138.
                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_a8.this != (HPresolve *)0x0) {
            operator_delete(local_a8.this);
          }
        }
      }
      pHVar8 = (HighsPostsolveStack *)pHVar8->debug_prev_numreductions;
    } while (pHVar8 != (HighsPostsolveStack *)0x0);
  }
  local_a8.this = (HPresolve *)local_f8;
  pHVar12 = (HighsDomain *)
            local_68.
            super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_68.
      super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_68.
      super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar7 = ((long)local_68.
                   super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_68.
                   super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
    iVar9 = 0;
    if (1 < uVar7) {
      iVar9 = 0;
      do {
        uVar7 = (long)uVar7 >> 1;
        iVar9 = iVar9 + 1;
      } while (1 < uVar7);
    }
    pdqsort_detail::
    pdqsort_loop<__gnu_cxx::__normal_iterator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>*,std::vector<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>,std::allocator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>>>>,presolve::HPresolve::liftingForProbing(presolve::HighsPostsolveStack&)::__4,false>
              ((__normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
                )local_68.
                 super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
                )local_68.
                 super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(anon_class_8_1_0b815314 *)&local_a8,
               iVar9,true);
    pHVar12 = (HighsDomain *)
              local_68.
              super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  pHVar8 = (HighsPostsolveStack *)
           (((long)pHVar12 -
             (long)local_68.
                   super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555552);
  local_118 = (HighsPostsolveStack *)
              ((ulong)(long)((int)((ulong)((long)(this->Avalue).
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(this->Avalue).
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_start) >> 3) -
                            (int)((ulong)((long)(this->freeslots).
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this->freeslots).
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start) >> 2)) / 100);
  if (local_118 <= pHVar8 && (long)pHVar8 - (long)local_118 != 0) {
    local_118 = pHVar8;
  }
  if (pHVar12 ==
      (HighsDomain *)
      local_68.
      super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar7 = 0;
    p_Var10 = (_Base_ptr)0x0;
    pHVar8 = (HighsPostsolveStack *)0x0;
  }
  else {
    p_Var10 = (_Base_ptr)0x0;
    uVar7 = 0;
    pHVar8 = (HighsPostsolveStack *)0x0;
    pHVar16 = (HighsDomain *)
              local_68.
              super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_120 = pHVar12;
    do {
      pHVar17 = (HighsCliqueTable *)
                (long)(((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                         *)&pHVar16->changedcolsflags_)->
                      super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      ).super__Tuple_impl<2UL,_double,_int>.super__Tuple_impl<3UL,_int>.
                      super__Head_base<3UL,_int,_false>._M_head_impl;
      pHVar15 = (HighsPostsolveStack *)
                ((long)&(pHVar17->cliqueentries).
                        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        ._M_impl.super__Vector_impl_data._M_start +
                (long)&pHVar8->debug_prev_numreductions);
      if (local_118 < pHVar15) break;
      local_16c._44_4_ = (int)uVar7;
      iVar9 = *(int *)&(pHVar16->changedcols_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage;
      ppVar13 = (((_Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                   *)&pHVar16->changedcolsflags_)->
                super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                ).
                super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                ._M_head_impl.
                super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar3 = (pointer)(pHVar16->changedcols_).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
      lVar18 = (long)ppVar3 - (long)ppVar13;
      local_110 = pHVar17;
      local_108 = pHVar15;
      local_100 = p_Var10;
      local_48 = pHVar16;
      if (lVar18 == 0) {
        local_16c._4_8_ = 0.0;
        local_16c._12_8_ = 0.0;
      }
      else {
        local_16c._12_8_ = 0.0;
        local_16c._4_8_ = 0.0;
        do {
          addToMatrix(this,iVar9,(uint)ppVar13->first & 0x7fffffff,ppVar13->second);
          if (-1 < (int)ppVar13->first) {
            dVar22 = ppVar13->second;
            dVar21 = (double)local_16c._12_8_ + dVar22;
            local_16c._4_8_ =
                 (double)local_16c._4_8_ +
                 ((double)local_16c._12_8_ - (dVar21 - dVar22)) +
                 (dVar22 - (dVar21 - (dVar21 - dVar22)));
            local_16c._12_8_ = dVar21;
          }
          ppVar13 = ppVar13 + 1;
        } while (ppVar13 != ppVar3);
      }
      pHVar20 = this->model;
      pdVar4 = (pHVar20->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar22 = pdVar4[iVar9];
      if (-INFINITY < dVar22) {
        pdVar4[iVar9] = dVar22 + (double)local_16c._4_8_ + (double)local_16c._12_8_;
      }
      pdVar4 = (pHVar20->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar22 = pdVar4[iVar9];
      if (dVar22 < INFINITY) {
        pdVar4[iVar9] = (double)local_16c._4_8_ + (double)local_16c._12_8_ + dVar22;
      }
      p_Var10 = (_Base_ptr)((long)local_100 + ((lVar18 >> 4) - (long)local_110));
      uVar7 = (ulong)(local_16c._44_4_ + 1);
      pHVar16 = (HighsDomain *)&local_48->propRowNumChangedBounds_;
      pHVar8 = local_108;
    } while (pHVar16 != local_120);
  }
  RVar5 = kOk;
  pHVar15 = (HighsPostsolveStack *)&DAT_00000001;
  highsLogDev(&(this->options->super_HighsOptionsStruct).log_options,kInfo,
              "Lifting for probing removed %d and modified %d row(s), added %d new and modified %d existing nonzero(s)\n"
              ,local_16c._36_8_,uVar7,pHVar8,(int)p_Var10);
LAB_0030c52b:
  std::
  _Rb_tree<HighsCliqueTable::CliqueVar,_std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>,_std::_Select1st<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/presolve/HPresolve.cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
  ::_M_erase((_Rb_tree<HighsCliqueTable::CliqueVar,_std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>,_std::_Select1st<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
              *)local_e8._M_parent,(_Link_type)pHVar15);
  std::
  vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
  ::~vector(&local_68);
  return RVar5;
}

Assistant:

HPresolve::Result HPresolve::liftingForProbing(
    HighsPostsolveStack& postsolve_stack) {
  // this method implements lifting for probing as described by Achterberg et
  // al. (2019) Presolve Reductions in Mixed Integer Programming. INFORMS
  // Journal on Computing 32(2):473-506.
  HighsCliqueTable& cliquetable = mipsolver->mipdata_->cliquetable;
  const HighsDomain& domain = mipsolver->mipdata_->domain;

  // collect best lifting opportunity for each row in a vector
  typedef std::pair<HighsCliqueTable::CliqueVar, double> liftingvar;
  typedef std::tuple<HighsInt, std::vector<liftingvar>, double, HighsInt>
      liftingdata;
  std::vector<liftingdata> liftingtable;
  liftingtable.reserve(liftingOpportunities.size());

  // remember overall best score
  double bestscoretotal = -kHighsInf;

  // is lifting allowed to add non-zeros?
  const bool fillallowed = mipsolver->options_mip_->mip_lifting_for_probing > 0;

  // store clique variables and coefficients in a map
  auto comp = [](const HighsCliqueTable::CliqueVar& c1,
                 const HighsCliqueTable::CliqueVar& c2) {
    return c1.col < c2.col || (c1.col == c2.col && c1.val < c2.val);
  };
  std::map<HighsCliqueTable::CliqueVar, std::pair<double, HighsInt>,
           decltype(comp)>
      coefficients(comp);

  // consider lifting opportunities
  size_t numrowsremoved = 0;
  for (const auto& elm : liftingOpportunities) {
    // get row index and skip deleted rows
    HighsInt row = elm.first;
    if (rowDeleted[row]) continue;

    // do not add non-zeros to dense rows
    const bool dense =
        rowsize[row] >
        std::max(HighsInt{1000}, (model->num_col_ - numDeletedCols) / 20);

    // iterate over elements in hash tree
    const auto& htree = elm.second;
    bool isredundant = false;
    htree.for_each([&](const std::pair<HighsInt, HighsInt>& data, double coef) {
      HighsInt col = data.first;
      HighsInt val = data.second;
      HighsInt pos = findNonzero(row, col);
      isredundant = isredundant || htree.contains(std::make_pair(col, 1 - val));
      if (!dense && (fillallowed || pos != -1) && !colDeleted[col] &&
          !domain.isFixed(col))
        coefficients[HighsCliqueTable::CliqueVar{col, val}] = {coef, pos};
    });

    // remove redundant rows
    if (isredundant) {
      numrowsremoved++;
      postsolve_stack.redundantRow(row);
      removeRow(row);
      coefficients.clear();
      HPRESOLVE_CHECKED_CALL(checkLimits(postsolve_stack));
      continue;
    }

    // skip rows with empty coefficient map
    if (coefficients.empty()) continue;

    // vector to hold best clique
    std::vector<liftingvar> bestclique;
    double bestscore = -kHighsInf;
    HighsInt bestnfill = 0;

    // lambda for computing coefficient difference
    auto computeCoeffDiff = [&](double newvalue, HighsInt nzpos) {
      return std::fabs(newvalue - (nzpos == -1 ? 0 : Avalue[nzpos]));
    };

    // store candidates in a vector
    std::vector<HighsCliqueTable::CliqueVar> candidates;
    candidates.reserve(coefficients.size());
    for (const auto& elm : coefficients) {
      candidates.push_back(elm.first);
      // initialize best clique
      double score = computeCoeffDiff(elm.second.first, elm.second.second);
      if (score > bestscore) {
        bestscore = score;
        bestnfill = elm.second.second == -1 ? 1 : 0;
        bestclique = {std::make_pair(elm.first, elm.second.first)};
      }
    }

    if (candidates.size() > 1) {
      // compute cliques
      auto cliques =
          cliquetable.computeMaximalCliques(candidates, primal_feastol);

      // identify clique with highest score
      for (const auto& clique : cliques) {
        HighsCDouble score = 0;
        HighsInt nfill = 0;
        for (const auto& cliquevar : clique) {
          score += computeCoeffDiff(coefficients[cliquevar].first,
                                    coefficients[cliquevar].second);
          if (coefficients[cliquevar].second == -1) nfill++;
        }
        if (score > bestscore) {
          bestscore = static_cast<double>(score);
          bestnfill = nfill;
          bestclique.clear();
          bestclique.reserve(clique.size());
          for (const auto& cliquevar : clique) {
            bestclique.emplace_back(cliquevar, coefficients[cliquevar].first);
          }
        }
      }
    }

    // store best clique
    liftingtable.emplace_back(row, bestclique, bestscore, bestnfill);
    bestscoretotal = std::max(bestscoretotal, bestscore);
    coefficients.clear();
  }

  // lambda for computing score
  auto computeOverallScore = [&](double score, HighsInt numelms,
                                 HighsInt numfillin) {
    const double weight = 0.5;
    return weight * (score / bestscoretotal) +
           (1 - weight) * static_cast<double>(numelms - numfillin) /
               static_cast<double>(numelms);
  };

  // sort according to score
  pdqsort(
      liftingtable.begin(), liftingtable.end(),
      [&](const liftingdata& opp1, const liftingdata& opp2) {
        double score1 = computeOverallScore(
            std::get<2>(opp1), static_cast<HighsInt>(std::get<1>(opp1).size()),
            std::get<3>(opp1));
        double score2 = computeOverallScore(
            std::get<2>(opp2), static_cast<HighsInt>(std::get<1>(opp2).size()),
            std::get<3>(opp2));
        return (score1 == score2 ? std::get<0>(opp1) < std::get<0>(opp2)
                                 : score1 > score2);
      });

  // perform actual lifting
  size_t nfill = 0;
  size_t nmod = 0;
  size_t numrowsmodified = 0;
  const size_t maxnfill = std::max(10 * liftingtable.size(),
                                   static_cast<size_t>(numNonzeros()) / 100);
  for (const auto& lifting : liftingtable) {
    // get clique
    HighsInt row = std::get<0>(lifting);
    const auto& bestclique = std::get<1>(lifting);

    // check against max. fill-in
    size_t newfill = static_cast<size_t>(std::get<3>(lifting));
    if (nfill + newfill > maxnfill) break;
    nfill += newfill;
    nmod += bestclique.size() - newfill;

    // update matrix
    HighsCDouble update = 0.0;
    for (const auto& elm : bestclique) {
      // get data
      const auto& cliquevar = std::get<0>(elm);
      const double& coeff = std::get<1>(elm);
      // add non-zero to matrix
      addToMatrix(row, cliquevar.col, coeff);
      // compute term to update left-hand / right-hand side
      if (cliquevar.val == 0) update += coeff;
    }

    // update left-hand / right-hand sides
    numrowsmodified++;
    if (model->row_lower_[row] != -kHighsInf)
      model->row_lower_[row] += static_cast<double>(update);
    if (model->row_upper_[row] != kHighsInf)
      model->row_upper_[row] += static_cast<double>(update);
  }

  highsLogDev(options->log_options, HighsLogType::kInfo,
              "Lifting for probing removed %d and modified %d row(s), added %d "
              "new and modified %d existing nonzero(s)\n",
              static_cast<int>(numrowsremoved),
              static_cast<int>(numrowsmodified), static_cast<int>(nfill),
              static_cast<int>(nmod));

  return Result::kOk;
}